

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzhamtest.cpp
# Opt level: O2

bool compress_file(ilzham *lzham_dll,char *pSrc_filename,char *pDst_filename,comp_options *options,
                  char *pSeed_filename,float *pTotal_comp_time)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  lzham_compress_status_t lVar4;
  lzham_uint32 lVar5;
  FILE *__stream;
  FILE *__stream_00;
  ulong uVar6;
  void *__ptr;
  lzham_uint8 *__ptr_00;
  timer_ticks tVar7;
  lzham_compress_state_ptr pvVar8;
  timer_ticks tVar9;
  lzham_compress_state_ptr pvVar10;
  size_t sVar11;
  __off64_t _Var12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  char *pMsg;
  size_t __n;
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float local_10c;
  ulong local_a8;
  size_t out_num_bytes;
  int local_98;
  uint local_94;
  lzham_compress_params local_90;
  timer_ticks local_58;
  size_t num_in_bytes;
  float *local_48;
  __off64_t local_40;
  double local_38;
  
  if (pTotal_comp_time != (float *)0x0) {
    *pTotal_comp_time = 0.0;
  }
  puts("Testing: Streaming compression");
  __stream = fopen64(pSrc_filename,"rb");
  if (__stream == (FILE *)0x0) {
    pMsg = "Unable to read file: %s\n";
    pDst_filename = pSrc_filename;
  }
  else {
    __stream_00 = fopen64(pDst_filename,"wb");
    if (__stream_00 != (FILE *)0x0) {
      local_48 = pTotal_comp_time;
      fseeko64(__stream,0,2);
      uVar6 = ftello64(__stream);
      fseeko64(__stream,0,0);
      fputc(0x4c,__stream_00);
      fputc(0x5a,__stream_00);
      fputc(0x48,__stream_00);
      fputc(0x30,__stream_00);
      fputc(options->m_dict_size_log2,__stream_00);
      for (lVar16 = 0; lVar16 != 0x40; lVar16 = lVar16 + 8) {
        fputc((uint)(uVar6 >> ((byte)lVar16 & 0x3f)) & 0xff,__stream_00);
      }
      local_40 = ftello64(__stream_00);
      __ptr = (void *)memalign(0x10,0x40000);
      __ptr_00 = (lzham_uint8 *)memalign(0x10,0x40000);
      if (__ptr == (void *)0x0 || __ptr_00 == (lzham_uint8 *)0x0) {
        print_error("Out of memory!\n");
        free(__ptr);
        free(__ptr_00);
        fclose(__stream);
        fclose(__stream_00);
        return false;
      }
      local_58 = timer::get_ticks();
      local_90.m_pSeed_bytes = (void *)0x0;
      local_90.m_table_max_update_interval = 0;
      local_90.m_table_update_interval_slow_rate = 0;
      local_90.m_num_seed_bytes = 0;
      local_90._28_4_ = 0;
      local_90.m_struct_size = 0x38;
      local_90.m_dict_size_log2 = options->m_dict_size_log2;
      local_90.m_compress_flags = 0;
      local_90.m_max_helper_threads = options->m_max_helper_threads;
      local_90.m_level = options->m_comp_level;
      uVar3 = 0;
      if (options->m_extreme_parsing == true) {
        local_90.m_compress_flags = 2;
        uVar3 = 2;
      }
      uVar2 = uVar3;
      if (options->m_deterministic_parsing == true) {
        uVar2 = uVar3 | 4;
        local_90._16_8_ = CONCAT44(uVar3,local_90.m_max_helper_threads) | 0x400000000;
      }
      uVar3 = uVar2;
      if (options->m_tradeoff_decomp_rate_for_comp_ratio == true) {
        uVar3 = uVar2 | 0x10;
        local_90._16_8_ = CONCAT44(uVar2,local_90.m_max_helper_threads) | 0x1000000000;
      }
      uVar2 = uVar3;
      if (options->m_force_single_threaded_parsing == true) {
        uVar2 = uVar3 | 0x40;
        local_90._16_8_ = CONCAT44(uVar3,local_90.m_max_helper_threads) | 0x4000000000;
      }
      if (options->m_low_memory_finder == true) {
        local_90._16_8_ = CONCAT44(uVar2,local_90.m_max_helper_threads) | 0x8000000000;
      }
      local_90.m_fast_bytes = options->m_fast_bytes;
      local_90.m_table_update_rate = options->m_table_update_rate;
      local_90.m_extreme_parsing_max_best_arrivals = options->m_max_best_arrivals;
      if ((pSeed_filename != (char *)0x0) &&
         (bVar1 = read_seed_file(pSeed_filename,&local_90.m_num_seed_bytes,&local_90.m_pSeed_bytes,
                                 local_90.m_dict_size_log2), !bVar1)) {
        free(__ptr);
        free(__ptr_00);
        fclose(__stream);
        fclose(__stream_00);
        return false;
      }
      tVar7 = timer::get_ticks();
      pvVar8 = (*lzham_dll->lzham_compress_init)(&local_90);
      tVar9 = timer::get_ticks();
      dVar17 = timer::ticks_to_secs(tVar9 - tVar7);
      if (pvVar8 != (lzham_compress_state_ptr)0x0) {
        if ((options->m_test_compressor_reinit != true) ||
           (pvVar10 = (*lzham_dll->lzham_compress_reinit)(pvVar8),
           pvVar10 != (lzham_compress_state_ptr)0x0)) {
          dVar18 = timer::ticks_to_secs(tVar9 - tVar7);
          printf("lzham_compress_init took %3.3fms\n",dVar18 * 1000.0);
          local_10c = (float)dVar17;
          local_94 = (uint)options->m_test_compressor_reinit;
          local_98 = local_94 + 1;
          lVar4 = LZHAM_COMP_STATUS_FAILED;
          iVar14 = 0;
          uVar3 = 0;
          __n = 0;
          local_a8 = uVar6;
          do {
            if (iVar14 == local_98) {
              tVar7 = timer::get_ticks();
              lVar5 = (*lzham_dll->lzham_compress_deinit)(pvVar8);
              tVar9 = timer::get_ticks();
              dVar17 = timer::ticks_to_secs(tVar9 - tVar7);
              local_10c = local_10c + (float)dVar17;
              if (local_48 != (float *)0x0) {
                *local_48 = local_10c;
              }
              tVar9 = timer::get_ticks();
              tVar7 = 1;
              if (tVar9 - local_58 != 0) {
                tVar7 = tVar9 - local_58;
              }
              dVar17 = timer::ticks_to_secs(tVar7);
              uVar13 = ftello64(__stream_00);
              free(__ptr);
              free(__ptr_00);
              free(local_90.m_pSeed_bytes);
              local_90.m_pSeed_bytes = (void *)0x0;
              fclose(__stream);
              fclose(__stream_00);
              if (lVar4 == LZHAM_COMP_STATUS_FIRST_SUCCESS_OR_FAILURE_CODE) {
                if (local_a8 + ((int)__n - uVar3) == 0) {
                  puts("Success");
                  printf("Input file size: %llu, Compressed file size: %llu, Ratio: %3.2f%%\n",uVar6
                         ,uVar13);
                  printf("Compression-only time: %3.6f\nConsumption rate: %9.1f bytes/sec, Emission rate: %9.1f bytes/sec\n"
                         ,(double)local_10c,(double)((float)uVar6 / local_10c),
                         SUB84((double)((float)uVar13 / local_10c),0));
                  auVar19._8_4_ = (int)(uVar6 >> 0x20);
                  auVar19._0_8_ = uVar6;
                  auVar19._12_4_ = 0x45300000;
                  auVar21._8_4_ = (int)(uVar13 >> 0x20);
                  auVar21._0_8_ = uVar13;
                  auVar21._12_4_ = 0x45300000;
                  printf("Total time: %3.6f\nConsumption rate: %9.1f bytes/sec, Emission rate: %9.1f bytes/sec\n"
                         ,dVar17,((auVar19._8_8_ - 1.9342813113834067e+25) +
                                 ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0)) /
                                 dVar17,
                         SUB84(((auVar21._8_8_ - 1.9342813113834067e+25) +
                               ((double)CONCAT44(0x43300000,(int)uVar13) - 4503599627370496.0)) /
                               dVar17,0));
                  printf("Input file adler32: 0x%08X\n",(ulong)lVar5);
                  return true;
                }
                print_error("Compressor failed to consume entire input file!\n");
                return false;
              }
              print_error("Compression failed with status %i\n",(ulong)lVar4);
              return false;
            }
            do {
              if (uVar6 != 0) {
                tVar7 = timer::get_ticks();
                local_38 = timer::ticks_to_secs(tVar7 - local_58);
                lVar16 = uVar6 - local_a8;
                auVar20._8_4_ = (int)((ulong)lVar16 >> 0x20);
                auVar20._0_8_ = lVar16;
                auVar20._12_4_ = 0x45300000;
                dVar17 = ((auVar20._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)lVar16) - 4503599627370496.0)) / local_38
                ;
                iVar15 = 0xf;
                while (bVar1 = iVar15 != 0, iVar15 = iVar15 + -1, bVar1) {
                  printf("\b\b\b\b");
                }
                printf("Progress: %3.1f%%, Bytes Remaining: %3.1fMB, %3.3fMB/sec",
                       (double)((1.0 - (float)local_a8 / (float)uVar6) * 100.0),
                       (double)((float)local_a8 * 9.536743e-07),
                       -(uint)(0.0 < local_38) & SUB84(dVar17 * 9.5367431640625e-07,0));
                printf("                \b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b");
              }
              if (uVar3 == (uint)__n) {
                __n = 0x40000;
                if (local_a8 < 0x40000) {
                  __n = local_a8;
                }
                sVar11 = fread(__ptr,1,__n,__stream);
                if (sVar11 == __n) {
                  local_a8 = local_a8 - __n;
                  uVar3 = 0;
                  goto LAB_00105ba5;
                }
                putchar(10);
                print_error("Failure reading from source file!\n");
LAB_00105de6:
                free(__ptr);
                free(__ptr_00);
                fclose(__stream);
                goto LAB_00105e02;
              }
LAB_00105ba5:
              num_in_bytes = (size_t)((int)__n - uVar3);
              out_num_bytes = 0x40000;
              tVar7 = timer::get_ticks();
              lVar4 = (*lzham_dll->lzham_compress)
                                (pvVar8,(lzham_uint8 *)((ulong)uVar3 + (long)__ptr),&num_in_bytes,
                                 __ptr_00,&out_num_bytes,SUB14(local_a8 == 0,0));
              tVar9 = timer::get_ticks();
              dVar17 = timer::ticks_to_secs(tVar9 - tVar7);
              uVar3 = uVar3 + (int)num_in_bytes;
              if ((out_num_bytes != 0) &&
                 (sVar11 = fwrite(__ptr_00,1,out_num_bytes & 0xffffffff,__stream_00),
                 sVar11 != out_num_bytes)) {
                putchar(10);
                print_error("Failure writing to destination file!\n");
                goto LAB_00105de6;
              }
              local_10c = local_10c + (float)dVar17;
            } while (lVar4 < LZHAM_COMP_STATUS_FIRST_SUCCESS_OR_FAILURE_CODE);
            iVar15 = 0xf;
            while (bVar1 = iVar15 != 0, iVar15 = iVar15 + -1, bVar1) {
              printf("\b\b\b\b    \b\b\b\b");
            }
            if (((byte)local_94 & iVar14 == 0) != 0) {
              putchar(10);
              _Var12 = ftello64(__stream_00);
              printf("Input file size: %llu, Compressed file size: %llu, Ratio: %3.2f%%\n",uVar6,
                     _Var12);
              tVar7 = timer::get_ticks();
              pvVar10 = (*lzham_dll->lzham_compress_reinit)(pvVar8);
              if (pvVar10 == (lzham_compress_state_ptr)0x0) {
                print_error("Failed reinitializing compressor!\n");
                free(__ptr);
                free(__ptr_00);
                fclose(__stream);
LAB_00105e02:
                fclose(__stream_00);
                free(local_90.m_pSeed_bytes);
                (*lzham_dll->lzham_compress_deinit)(pvVar8);
                return false;
              }
              tVar9 = timer::get_ticks();
              dVar17 = timer::ticks_to_secs(tVar9 - tVar7);
              printf("lzham_compress_reinit took %3.3fms\n",dVar17 * 1000.0);
              uVar3 = 0;
              fseek(__stream,0,0);
              fseek(__stream_00,local_40,0);
              __n = 0;
              local_a8 = uVar6;
            }
            iVar14 = iVar14 + 1;
          } while( true );
        }
        (*lzham_dll->lzham_compress_deinit)(pvVar8);
      }
      print_error("Failed initializing compressor!\n");
      free(__ptr);
      free(__ptr_00);
      fclose(__stream);
      fclose(__stream_00);
      free(local_90.m_pSeed_bytes);
      return false;
    }
    pMsg = "Unable to create file: %s\n";
  }
  print_error(pMsg,pDst_filename);
  return false;
}

Assistant:

static bool compress_file(ilzham &lzham_dll, const char* pSrc_filename, const char *pDst_filename, const comp_options &options, const char *pSeed_filename, float *pTotal_comp_time = NULL)
{
	if (pTotal_comp_time)
		*pTotal_comp_time = 0;

   printf("Testing: Streaming compression\n");

   FILE *pInFile = fopen(pSrc_filename, "rb");
   if (!pInFile)
   {
      print_error("Unable to read file: %s\n", pSrc_filename);
      return false;
   }

   FILE *pOutFile = fopen(pDst_filename, "wb");
   if (!pOutFile)
   {
      print_error("Unable to create file: %s\n", pDst_filename);
      return false;
   }

   _fseeki64(pInFile, 0, SEEK_END);
   uint64 src_file_size = _ftelli64(pInFile);
   _fseeki64(pInFile, 0, SEEK_SET);

   fputc('L', pOutFile);
   fputc('Z', pOutFile);
   fputc('H', pOutFile);
   fputc('0', pOutFile);
   fputc(options.m_dict_size_log2, pOutFile);

   for (uint i = 0; i < 8; i++)
   {
      fputc(static_cast<int>((src_file_size >> (i * 8)) & 0xFF), pOutFile);
   }

   uint64 cmp_file_header_size = _ftelli64(pOutFile);

   const uint cInBufSize = LZHAMTEST_COMP_INPUT_BUFFER_SIZE;
   const uint cOutBufSize = LZHAMTEST_COMP_OUTPUT_BUFFER_SIZE;

   uint8 *in_file_buf = static_cast<uint8*>(_aligned_malloc(cInBufSize, 16));
   uint8 *out_file_buf = static_cast<uint8*>(_aligned_malloc(cOutBufSize, 16));
   if ((!in_file_buf) || (!out_file_buf))
   {
      print_error("Out of memory!\n");
      _aligned_free(in_file_buf);
      _aligned_free(out_file_buf);
      fclose(pInFile);
      fclose(pOutFile);
      return false;
   }

   uint64 src_bytes_left = src_file_size;

   uint in_file_buf_size = 0;
   uint in_file_buf_ofs = 0;

   uint64 total_output_bytes = 0;

   timer_ticks start_time = timer::get_ticks();

   lzham_compress_params params;
   memset(&params, 0, sizeof(params));
   params.m_struct_size = sizeof(lzham_compress_params);
   params.m_dict_size_log2 = options.m_dict_size_log2;
   params.m_max_helper_threads = options.m_max_helper_threads;
   params.m_level = options.m_comp_level;
   if (options.m_extreme_parsing)
      params.m_compress_flags |= LZHAM_COMP_FLAG_EXTREME_PARSING;
   if (options.m_deterministic_parsing)
      params.m_compress_flags |= LZHAM_COMP_FLAG_DETERMINISTIC_PARSING;
   if (options.m_tradeoff_decomp_rate_for_comp_ratio)
      params.m_compress_flags |= LZHAM_COMP_FLAG_TRADEOFF_DECOMPRESSION_RATE_FOR_COMP_RATIO;
   if (options.m_force_single_threaded_parsing)
      params.m_compress_flags |= LZHAM_COMP_FLAG_FORCE_SINGLE_THREADED_PARSING;
   if (options.m_low_memory_finder)
      params.m_compress_flags |= LZHAM_COMP_FLAG_USE_LOW_MEMORY_MATCH_FINDER;
   params.m_fast_bytes = options.m_fast_bytes;

   params.m_table_update_rate = options.m_table_update_rate;
   params.m_extreme_parsing_max_best_arrivals  = options.m_max_best_arrivals;

   if (pSeed_filename)
   {
      if (!read_seed_file(pSeed_filename, params.m_num_seed_bytes, params.m_pSeed_bytes, params.m_dict_size_log2))
      {
         _aligned_free(in_file_buf);
         _aligned_free(out_file_buf);
         fclose(pInFile);
         fclose(pOutFile);
         return false;
      }
   }

   timer_ticks init_start_time = timer::get_ticks();
   lzham_compress_state_ptr pComp_state = lzham_dll.lzham_compress_init(&params);
   timer_ticks total_init_time = timer::get_ticks() - init_start_time;

	float total_comp_time = (float)timer::ticks_to_secs(total_init_time);

   if ((pComp_state) && (options.m_test_compressor_reinit))
   {
      if (!lzham_dll.lzham_compress_reinit(pComp_state))
      {
         lzham_dll.lzham_compress_deinit(pComp_state);
         pComp_state = NULL;
      }
   }

   if (!pComp_state)
   {
      print_error("Failed initializing compressor!\n");
      _aligned_free(in_file_buf);
      _aligned_free(out_file_buf);
      fclose(pInFile);
      fclose(pOutFile);
      _aligned_free((void*)params.m_pSeed_bytes);
      return false;
   }

   printf("lzham_compress_init took %3.3fms\n", timer::ticks_to_secs(total_init_time)*1000.0f);

   lzham_compress_status_t status = LZHAM_COMP_STATUS_FAILED;

   // Performs 1 pass normally, or 2 passes to test compressor reinitialization (with a reinit in between the passes).
   uint total_passes = options.m_test_compressor_reinit ? 2 : 1;
   for (uint pass = 0; pass < total_passes; ++pass)
   {
      for ( ; ; )
      {
         if (src_file_size)
         {
            double total_elapsed_time = timer::ticks_to_secs(timer::get_ticks() - start_time);
            double total_bytes_processed = static_cast<double>(src_file_size - src_bytes_left);
            double comp_rate = (total_elapsed_time > 0.0f) ? total_bytes_processed / total_elapsed_time : 0.0f;

   #ifdef LZHAM_PRINT_OUTPUT_PROGRESS
            for (int i = 0; i < 15; i++)
               printf("\b\b\b\b");
            printf("Progress: %3.1f%%, Bytes Remaining: %3.1fMB, %3.3fMB/sec", (1.0f - (static_cast<float>(src_bytes_left) / src_file_size)) * 100.0f, src_bytes_left / 1048576.0f, comp_rate / (1024.0f * 1024.0f));
            printf("                \b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b");
   #endif
         }

         if (in_file_buf_ofs == in_file_buf_size)
         {
            in_file_buf_size = static_cast<uint>(my_min(cInBufSize, src_bytes_left));

            if (fread(in_file_buf, 1, in_file_buf_size, pInFile) != in_file_buf_size)
            {
               printf("\n");
               print_error("Failure reading from source file!\n");
               _aligned_free(in_file_buf);
               _aligned_free(out_file_buf);
               fclose(pInFile);
               fclose(pOutFile);
               _aligned_free((void*)params.m_pSeed_bytes);
               lzham_dll.lzham_compress_deinit(pComp_state);
               return false;
            }

            src_bytes_left -= in_file_buf_size;

            in_file_buf_ofs = 0;
         }

         uint8 *pIn_bytes = &in_file_buf[in_file_buf_ofs];
         size_t num_in_bytes = in_file_buf_size - in_file_buf_ofs;
         uint8* pOut_bytes = out_file_buf;
         size_t out_num_bytes = cOutBufSize;

			timer_ticks comp_start_time = timer::get_ticks();
         status = lzham_dll.lzham_compress(pComp_state, pIn_bytes, &num_in_bytes, pOut_bytes, &out_num_bytes, src_bytes_left == 0);
			timer_ticks comp_time = timer::get_ticks() - comp_start_time;

			total_comp_time += (float)timer::ticks_to_secs(comp_time);

         if (num_in_bytes)
         {
            in_file_buf_ofs += (uint)num_in_bytes;
            assert(in_file_buf_ofs <= in_file_buf_size);
         }

         if (out_num_bytes)
         {
            if (fwrite(out_file_buf, 1, static_cast<uint>(out_num_bytes), pOutFile) != out_num_bytes)
            {
               printf("\n");
               print_error("Failure writing to destination file!\n");
               _aligned_free(in_file_buf);
               _aligned_free(out_file_buf);
               fclose(pInFile);
               fclose(pOutFile);
               _aligned_free((void*)params.m_pSeed_bytes);
               lzham_dll.lzham_compress_deinit(pComp_state);
               return false;
            }

            total_output_bytes += out_num_bytes;
         }

         if (status >= LZHAM_COMP_STATUS_FIRST_SUCCESS_OR_FAILURE_CODE)
            break;
      }

#ifdef LZHAM_PRINT_OUTPUT_PROGRESS
      for (int i = 0; i < 15; i++)
      {
         printf("\b\b\b\b    \b\b\b\b");
      }
#endif

      if ((pass == 0) && (total_passes == 2))
      {
         printf("\n");

         uint64 cmp_file_size = _ftelli64(pOutFile);
         printf("Input file size: " QUAD_INT_FMT ", Compressed file size: " QUAD_INT_FMT ", Ratio: %3.2f%%\n", src_file_size, cmp_file_size, src_file_size ? ((1.0f - (static_cast<float>(cmp_file_size) / src_file_size)) * 100.0f) : 0.0f);

         init_start_time = timer::get_ticks();
         if (!lzham_dll.lzham_compress_reinit(pComp_state))
         {
            print_error("Failed reinitializing compressor!\n");
            _aligned_free(in_file_buf);
            _aligned_free(out_file_buf);
            fclose(pInFile);
            fclose(pOutFile);
            _aligned_free((void*)params.m_pSeed_bytes);
            lzham_dll.lzham_compress_deinit(pComp_state);
            return false;
         }
         total_init_time = timer::get_ticks() - init_start_time;
         printf("lzham_compress_reinit took %3.3fms\n", timer::ticks_to_secs(total_init_time)*1000.0f);

         fseek(pInFile, 0, SEEK_SET);
         fseek(pOutFile, static_cast<long>(cmp_file_header_size), SEEK_SET);

         src_bytes_left = src_file_size;
         in_file_buf_size = 0;
         in_file_buf_ofs = 0;
         total_output_bytes = 0;
      }
   }

   src_bytes_left += (in_file_buf_size - in_file_buf_ofs);

	timer_ticks deinit_start_time = timer::get_ticks();
   uint32 adler32 = lzham_dll.lzham_compress_deinit(pComp_state);
	timer_ticks total_deinit_time = timer::get_ticks() - deinit_start_time;

	total_comp_time += (float)timer::ticks_to_secs(total_deinit_time);
	if (pTotal_comp_time)
		*pTotal_comp_time = total_comp_time;

   pComp_state = NULL;

   timer_ticks end_time = timer::get_ticks();
   double total_time = timer::ticks_to_secs(my_max(1, end_time - start_time));

   uint64 cmp_file_size = _ftelli64(pOutFile);

   _aligned_free(in_file_buf);
   in_file_buf = NULL;
   _aligned_free(out_file_buf);
   out_file_buf = NULL;
   _aligned_free((void*)params.m_pSeed_bytes);
   params.m_pSeed_bytes = NULL;

   fclose(pInFile);
   pInFile = NULL;
   fclose(pOutFile);
   pOutFile = NULL;

   if (status != LZHAM_COMP_STATUS_SUCCESS)
   {
      print_error("Compression failed with status %i\n", status);
      return false;
   }

   if (src_bytes_left)
   {
      print_error("Compressor failed to consume entire input file!\n");
      return false;
   }

   printf("Success\n");
   printf("Input file size: " QUAD_INT_FMT ", Compressed file size: " QUAD_INT_FMT ", Ratio: %3.2f%%\n", src_file_size, cmp_file_size, src_file_size ? ((1.0f - (static_cast<float>(cmp_file_size) / src_file_size)) * 100.0f) : 0.0f);
	printf("Compression-only time: %3.6f\nConsumption rate: %9.1f bytes/sec, Emission rate: %9.1f bytes/sec\n", total_comp_time, src_file_size / total_comp_time, cmp_file_size / total_comp_time);
   printf("Total time: %3.6f\nConsumption rate: %9.1f bytes/sec, Emission rate: %9.1f bytes/sec\n", total_time, src_file_size / total_time, cmp_file_size / total_time);
   printf("Input file adler32: 0x%08X\n", adler32);

   return true;
}